

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_mkdtemp(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_mkdtemp(loop,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    eval_a = 1;
    eval_b = (int64_t)mkdtemp_cb_count;
    if (eval_b == 1) {
      iVar1 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        check_mkdtemp_result(&mkdtemp_req2);
        pcVar3 = mkdtemp_req1.path;
        eval_a = 0;
        iVar1 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
        if (iVar1 == 0) {
          pcVar4 = "!=";
          pcVar5 = "strcmp(mkdtemp_req1.path, mkdtemp_req2.path)";
          pcVar3 = "0";
          uVar2 = 0x569;
          eval_b = 0;
        }
        else {
          rmdir(pcVar3);
          rmdir(mkdtemp_req2.path);
          uv_fs_req_cleanup(&mkdtemp_req1);
          uv_fs_req_cleanup(&mkdtemp_req2);
          close_loop(loop);
          eval_a = 0;
          iVar1 = uv_loop_close(loop);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "==";
          pcVar5 = "uv_loop_close(loop)";
          pcVar3 = "0";
          uVar2 = 0x571;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "r";
        uVar2 = 0x565;
      }
    }
    else {
      pcVar4 = "==";
      pcVar5 = "mkdtemp_cb_count";
      pcVar3 = "1";
      uVar2 = 0x561;
    }
  }
  else {
    pcVar4 = "==";
    pcVar5 = "0";
    pcVar3 = "r";
    uVar2 = 0x55e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, mkdtemp_cb_count);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT_OK(r);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT_NE(0, strcmp(mkdtemp_req1.path, mkdtemp_req2.path));

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}